

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O1

void kratos::merge_bundle_mapping
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>_>_>_>
                *old_mapping)

{
  _Base_ptr __k;
  PortDirection direction;
  undefined4 uVar1;
  undefined4 uVar2;
  Var *pVVar3;
  _Alloc_hider _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  undefined1 auVar7 [8];
  pointer pbVar8;
  uint uVar9;
  _Head_base<1UL,_unsigned_int,_false> _Var10;
  _Rb_tree_node_base *p_Var11;
  ulong uVar12;
  map<kratos::Generator_*,_unsigned_long,_std::less<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_unsigned_long>_>_>
  *pmVar13;
  mapped_type *pmVar14;
  long lVar15;
  PortPackedStruct *this;
  PackedSlice *new_var;
  const_iterator __first;
  InternalException *pIVar16;
  UserException *pUVar17;
  map<kratos::Generator_*,_unsigned_long,_std::less<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_unsigned_long>_>_>
  *pmVar18;
  undefined8 extraout_RDX;
  const_iterator __last;
  undefined1 auVar19 [8];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  key_type pGVar20;
  _Base_ptr p_Var21;
  _Base_ptr p_Var22;
  bool bVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  undefined1 local_178 [8];
  map<kratos::Generator_*,_unsigned_long,_std::less<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_unsigned_long>_>_>
  bundle_hashs;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>_>
  def;
  size_type local_120;
  undefined1 local_118 [8];
  shared_ptr<kratos::PortBundleRef> ref;
  shared_ptr<kratos::PortBundleRef> ref_port_ref;
  shared_ptr<kratos::PortBundleRef> ref_1;
  undefined1 local_d8 [8];
  uint64_t hash;
  undefined1 local_c8 [8];
  _Alloc_hider local_c0;
  undefined1 local_b8 [8];
  undefined1 local_b0 [48];
  _Alloc_hider local_80;
  undefined1 auStack_78 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ports;
  undefined1 local_58 [8];
  shared_ptr<kratos::PackedStruct> struct_;
  undefined8 local_38;
  
  local_80._M_p = (pointer)(old_mapping->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)local_80._M_p == &(old_mapping->_M_t)._M_impl.super__Rb_tree_header) {
      return;
    }
    bundle_hashs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&bundle_hashs;
    bundle_hashs._M_t._M_impl._0_4_ = 0;
    bundle_hashs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    bundle_hashs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    bundle_hashs._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    ref.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ref_port_ref.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    p_Var22 = ((_Base_ptr)((long)local_80._M_p + 0x40))->_M_parent;
    pGVar20 = (key_type)0x0;
    p_Var11 = bundle_hashs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (p_Var21 = *(_Base_ptr *)((long)local_80._M_p + 0x40);
        bundle_hashs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var11,
        p_Var21 != p_Var22; p_Var21 = (_Base_ptr)&p_Var21[1]._M_parent) {
      Generator::get_bundle_ref((Generator *)local_118,*(string **)(p_Var21 + 1));
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&bundle_hashs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)((long)local_118 + 0xc0));
      auStack_78 = (undefined1  [8])0x0;
      ports.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ports.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_78,local_120);
      p_Var11 = (_Rb_tree_node_base *)
                def.
                super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      auVar19 = auStack_78;
      pVVar3 = (Var *)ports.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
      while (auStack_78 = auVar19,
            ports.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)pVVar3,
            p_Var11 != (_Rb_tree_node_base *)&def) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string_const&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (p_Var11 + 1));
        p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
        auVar19 = auStack_78;
        pVVar3 = (Var *)ports.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
      }
      if (auVar19 != (undefined1  [8])pVVar3) {
        uVar12 = (long)pVVar3 - (long)auVar19 >> 5;
        lVar15 = 0x3f;
        if (uVar12 != 0) {
          for (; uVar12 >> lVar15 == 0; lVar15 = lVar15 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (auVar19,pVVar3,((uint)lVar15 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (auVar19,pVVar3);
      }
      pbVar8 = ports.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      __k = p_Var21 + 1;
      local_58 = (undefined1  [8])
                 &struct_.super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount;
      struct_.super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      struct_.super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ._0_1_ = 0;
      for (auVar19 = auStack_78; auVar19 != (undefined1  [8])pbVar8;
          auVar19 = (undefined1  [8])&(((Var *)auVar19)->super_IRNode).verilog_ln) {
        pGVar20 = *(key_type *)__k;
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&bundle_hashs._M_t._M_impl.super__Rb_tree_header._M_node_count,(key_type *)auVar19);
        Generator::get_port((Generator *)local_d8,(string *)pGVar20);
        auVar7 = local_d8;
        uVar9 = (**(code **)(*(long *)local_d8 + 0x38))(local_d8);
        local_c8._4_4_ = 0;
        local_c8._0_4_ = *(uint *)((long)auVar7 + 0x98);
        local_b8 = (undefined1  [8])(ulong)uVar9;
        local_b0._8_8_ = ZEXT18(*(byte *)((long)local_d8 + 0xf0));
        local_b0._24_8_ = (((Var *)auVar19)->super_IRNode)._vptr_IRNode;
        local_b0._32_8_ =
             (((Var *)auVar19)->super_IRNode).fn_name_ln.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        format_str.size_ = 0xd722;
        format_str.data_ = (char *)0xc;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)local_c8;
        fmt::v7::detail::vformat_abi_cxx11_
                  ((string *)
                   &ref_port_ref.
                    super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(detail *)"{0}{1}{2}{3}",format_str,args);
        std::__cxx11::string::_M_append
                  (local_58,(ulong)ref_port_ref.
                                   super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi);
        if (ref_port_ref.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            &ref_1.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ) {
          operator_delete(ref_port_ref.
                          super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi,
                          (ulong)((long)&(ref_1.
                                          super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
        }
        if (hash != 0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)hash);
        }
      }
      local_d8 = (undefined1  [8])
                 hash_64_fnv1a((void *)local_58,
                               (uint64_t)
                               struct_.
                               super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
      pmVar13 = &bundle_hashs;
      if (bundle_hashs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) {
        pmVar18 = (map<kratos::Generator_*,_unsigned_long,_std::less<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_unsigned_long>_>_>
                   *)bundle_hashs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
        do {
          bVar23 = (key_type)(pmVar18->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right <
                   *(key_type *)__k;
          if (!bVar23) {
            pmVar13 = pmVar18;
          }
          pmVar18 = (map<kratos::Generator_*,_unsigned_long,_std::less<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_unsigned_long>_>_>
                     *)(&(pmVar18->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent)[bVar23];
        } while (pmVar18 !=
                 (map<kratos::Generator_*,_unsigned_long,_std::less<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_unsigned_long>_>_>
                  *)0x0);
      }
      pmVar18 = &bundle_hashs;
      if ((pmVar13 != &bundle_hashs) &&
         (pmVar18 = pmVar13,
         *(key_type *)__k <
         (key_type)(pmVar13->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right)) {
        pmVar18 = &bundle_hashs;
      }
      if ((pmVar18 != &bundle_hashs) &&
         (pmVar14 = std::
                    map<kratos::Generator_*,_unsigned_long,_std::less<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_unsigned_long>_>_>
                    ::at((map<kratos::Generator_*,_unsigned_long,_std::less<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_unsigned_long>_>_>
                          *)local_178,(key_type *)__k), (undefined1  [8])*pmVar14 != local_d8)) {
        pUVar17 = (UserException *)__cxa_allocate_exception(0x10);
        ref_port_ref.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_80._M_p + 0x20)
        ;
        ref_1.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(element_type **)(local_80._M_p + 0x28);
        format_str_00.size_ = 0xd;
        format_str_00.data_ = (char *)0x38;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)
                 &ref_port_ref.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount;
        fmt::v7::detail::vformat_abi_cxx11_
                  ((string *)local_c8,
                   (detail *)"Port bundle with same name {0} have different definition",
                   format_str_00,args_00);
        UserException::UserException(pUVar17,(string *)local_c8);
        __cxa_throw(pUVar17,&UserException::typeinfo,std::runtime_error::~runtime_error);
      }
      std::
      _Rb_tree<kratos::Generator*,std::pair<kratos::Generator*const,unsigned_long>,std::_Select1st<std::pair<kratos::Generator*const,unsigned_long>>,std::less<kratos::Generator*>,std::allocator<std::pair<kratos::Generator*const,unsigned_long>>>
      ::_M_emplace_unique<kratos::Generator*const&,unsigned_long&>
                ((_Rb_tree<kratos::Generator*,std::pair<kratos::Generator*const,unsigned_long>,std::_Select1st<std::pair<kratos::Generator*const,unsigned_long>>,std::less<kratos::Generator*>,std::allocator<std::pair<kratos::Generator*const,unsigned_long>>>
                  *)local_178,(Generator **)__k,(unsigned_long *)local_d8);
      pGVar20 = *(key_type *)__k;
      ref.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ref_port_ref,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ref);
      if (local_58 !=
          (undefined1  [8])
          &struct_.super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      {
        operator_delete((void *)local_58,
                        CONCAT71(struct_.
                                 super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi._1_7_,
                                 struct_.
                                 super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi._0_1_) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_78);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&bundle_hashs._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (ref.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ref.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ;
      }
      p_Var11 = bundle_hashs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    }
    if (p_Var11 != (_Rb_tree_node_base *)&bundle_hashs) {
      bVar23 = false;
      p_Var21 = (_Base_ptr)0x0;
      do {
        p_Var22 = p_Var11[1]._M_parent;
        if (bVar23) {
          bVar24 = p_Var21 != p_Var22;
          p_Var22 = p_Var21;
          if (bVar24) {
            pUVar17 = (UserException *)__cxa_allocate_exception(0x10);
            bundle_hashs._M_t._M_impl.super__Rb_tree_header._M_node_count =
                 *(size_t *)(local_80._M_p + 0x20);
            def.
            super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>_>
            ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(local_80._M_p + 0x28);
            format_str_01.size_ = 0xd;
            format_str_01.data_ = (char *)0x38;
            args_01.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .field_1.args_ = in_R9.args_;
            args_01.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .desc_ = (unsigned_long_long)
                     &bundle_hashs._M_t._M_impl.super__Rb_tree_header._M_node_count;
            fmt::v7::detail::vformat_abi_cxx11_
                      ((string *)local_c8,
                       (detail *)"Port bundle with same name {0} have different definition",
                       format_str_01,args_01);
            UserException::UserException(pUVar17,(string *)local_c8);
            __cxa_throw(pUVar17,&UserException::typeinfo,std::runtime_error::~runtime_error);
          }
        }
        else {
          bVar23 = true;
        }
        p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
        p_Var21 = p_Var22;
      } while (p_Var11 != (_Rb_tree_node_base *)&bundle_hashs);
    }
    if (pGVar20 == (key_type)0x0) break;
    bundle_hashs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    def.
    super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    def.
    super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    p_Var5 = ref.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi + 0xc;
    p_Var11 = *(_Rb_tree_node_base **)
               &ref.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi[0xd]._M_use_count;
    _Var4._M_p = local_80._M_p;
    while (local_80._M_p = _Var4._M_p, p_Var11 != (_Rb_tree_node_base *)&p_Var5->_M_use_count) {
      Generator::get_port((Generator *)local_58,(string *)pGVar20);
      _Var10._M_head_impl =
           (**(code **)&(*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_58)[3]._M_use_count
           )();
      local_c8[0] = ((_Head_base<2UL,_bool,_false> *)((long)local_58 + 0xf0))->_M_head_impl;
      local_c8._4_4_ = _Var10._M_head_impl;
      local_c0._M_p = (pointer)(local_b8 + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c0,*(long *)(p_Var11 + 1),
                 (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
      std::
      vector<std::tuple<std::__cxx11::string,unsigned_int,bool>,std::allocator<std::tuple<std::__cxx11::string,unsigned_int,bool>>>
      ::emplace_back<std::tuple<std::__cxx11::string,unsigned_int,bool>>
                ((vector<std::tuple<std::__cxx11::string,unsigned_int,bool>,std::allocator<std::tuple<std::__cxx11::string,unsigned_int,bool>>>
                  *)&bundle_hashs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>
                  *)local_c8);
      if ((pointer)local_c0._M_p != (pointer)(local_b8 + 8)) {
        operator_delete(local_c0._M_p,(ulong)(local_b0._0_8_ + 1));
      }
      if (struct_.super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   struct_.super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
      }
      p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
      _Var4._M_p = local_80._M_p;
    }
    local_58 = (undefined1  [8])0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<kratos::PackedStruct,std::allocator<kratos::PackedStruct>,std::__cxx11::string_const&,std::vector<std::tuple<std::__cxx11::string,unsigned_int,bool>,std::allocator<std::tuple<std::__cxx11::string,unsigned_int,bool>>>&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&struct_,(PackedStruct **)local_58,
               (allocator<kratos::PackedStruct> *)local_c8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)_Var4._M_p + 0x20),
               (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>_>
                *)&bundle_hashs._M_t._M_impl.super__Rb_tree_header._M_node_count);
    p_Var22 = ((_Base_ptr)((long)_Var4._M_p + 0x40))->_M_parent;
    for (p_Var21 = *(_Base_ptr *)((long)_Var4._M_p + 0x40); p_Var21 != p_Var22;
        p_Var21 = (_Base_ptr)&p_Var21[1]._M_parent) {
      lVar15 = (**(code **)(**(long **)(p_Var21 + 1) + 0x20))();
      if (lVar15 == 0) {
        local_38 = (Generator *)0x0;
      }
      else {
        local_38 = __dynamic_cast(lVar15,&IRNode::typeinfo,&Generator::typeinfo,0);
      }
      Generator::get_bundle_ref
                ((Generator *)
                 &ref_port_ref.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,*(string **)(p_Var21 + 1));
      _Var6 = ref_port_ref.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
      Generator::get_port((Generator *)local_c8,*(string **)(p_Var21 + 1));
      direction = *(PortDirection *)
                   &(((pointer)((long)local_c8 + 0x270))->
                    super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if ((pointer)local_c0._M_p != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._M_p);
      }
      this = Generator::port_packed
                       (*(Generator **)(p_Var21 + 1),direction,(string *)p_Var21,
                        (shared_ptr<kratos::PackedStruct> *)local_58);
      uVar1 = _Var6._M_pi[0xd]._M_use_count;
      uVar2 = _Var6._M_pi[0xd]._M_weak_count;
      auVar25._4_4_ = uVar2;
      auVar25._0_4_ = uVar1;
      auVar25._8_8_ = extraout_RDX;
      while( true ) {
        p_Var11 = auVar25._0_8_;
        if (p_Var11 == (_Rb_tree_node_base *)&_Var6._M_pi[0xc]._M_use_count) break;
        Generator::get_port((Generator *)auStack_78,*(string **)(p_Var21 + 1));
        new_var = PortPackedStruct::operator[](this,(string *)(p_Var11 + 1));
        if (direction !=
            *(PortDirection *)&(((Var *)((long)auStack_78 + 0x270))->super_IRNode)._vptr_IRNode) {
          pIVar16 = (InternalException *)__cxa_allocate_exception(0x10);
          local_c8 = (undefined1  [8])local_b8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_c8,"Direction doesn\'t match","");
          InternalException::InternalException(pIVar16,(string *)local_c8);
          __cxa_throw(pIVar16,&InternalException::typeinfo,std::runtime_error::~runtime_error);
        }
        if (direction == In) {
          if ((Generator *)local_38 != (Generator *)0x0) {
            Var::move_src_to((Var *)auStack_78,(Var *)new_var,(Generator *)local_38,false);
          }
          Var::move_sink_to((Var *)auStack_78,(Var *)new_var,*(Generator **)(p_Var21 + 1),false);
        }
        else {
          Var::move_src_to((Var *)auStack_78,(Var *)new_var,*(Generator **)(p_Var21 + 1),false);
          if ((Generator *)local_38 != (Generator *)0x0) {
            Var::move_sink_to((Var *)auStack_78,(Var *)new_var,(Generator *)local_38,false);
          }
        }
        Generator::remove_port(*(Generator **)(p_Var21 + 1),(string *)(p_Var11 + 2));
        if (ports.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ports.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
        }
        auVar25 = std::_Rb_tree_increment(p_Var11);
      }
      lVar15 = *(long *)(p_Var21 + 1);
      __first._M_node =
           (_Base_ptr)
           std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::PortBundleRef>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::PortBundleRef>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::PortBundleRef>_>_>_>
           ::equal_range((pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::PortBundleRef>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::PortBundleRef>_>_>_>
                          *)(lVar15 + 0x1c8),
                         (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::PortBundleRef>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::PortBundleRef>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::PortBundleRef>_>_>_>
                          *)p_Var21,auVar25._8_8_);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::PortBundleRef>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::PortBundleRef>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::PortBundleRef>_>_>_>
      ::_M_erase_aux((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::PortBundleRef>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::PortBundleRef>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::PortBundleRef>_>_>_>
                      *)(lVar15 + 0x1c8),__first,__last);
      if (ref_1.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ref_1.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
      }
    }
    if (struct_.super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 struct_.super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                );
    }
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>_>
    ::~vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>_>
               *)&bundle_hashs._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (ref_port_ref.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ref_port_ref.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
    }
    std::
    _Rb_tree<kratos::Generator_*,_std::pair<kratos::Generator_*const,_unsigned_long>,_std::_Select1st<std::pair<kratos::Generator_*const,_unsigned_long>_>,_std::less<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_unsigned_long>_>_>
    ::~_Rb_tree((_Rb_tree<kratos::Generator_*,_std::pair<kratos::Generator_*const,_unsigned_long>,_std::_Select1st<std::pair<kratos::Generator_*const,_unsigned_long>_>,_std::less<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_unsigned_long>_>_>
                 *)local_178);
    local_80._M_p = (pointer)std::_Rb_tree_increment(local_80._M_p);
  }
  pIVar16 = (InternalException *)__cxa_allocate_exception(0x10);
  local_c8 = (undefined1  [8])local_b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c8,"ref generator cannot be null","");
  InternalException::InternalException(pIVar16,(string *)local_c8);
  __cxa_throw(pIVar16,&InternalException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void merge_bundle_mapping(
    const std::map<std::string, std::vector<std::pair<std::string, Generator*>>>& old_mapping) {
    for (auto const& [bundle_name, generators] : old_mapping) {
        std::map<Generator*, uint64_t> bundle_hashs;
        std::shared_ptr<PortBundleRef> ref_port_ref;
        Generator* ref_generator = nullptr;
        for (auto const& [entry_name, generator] : generators) {
            auto ref = generator->get_bundle_ref(entry_name);
            auto mappings = ref->name_mappings();
            std::vector<std::string> ports;
            ports.reserve(mappings.size());
            for (auto const& iter : mappings) {
                ports.emplace_back(iter.first);
            }
            std::sort(ports.begin(), ports.end());
            std::string base_str;
            for (auto const& port_name : ports) {
                auto port = generator->get_port(mappings.at(port_name));
                base_str.append(::format("{0}{1}{2}{3}", port->var_width(), port->width(),
                                         port->is_signed(), port_name));
            }
            uint64_t hash = hash_64_fnv1a(base_str.c_str(), base_str.size());
            if (bundle_hashs.find(generator) != bundle_hashs.end()) {
                if (bundle_hashs.at(generator) != hash)
                    throw UserException(::format(
                        "Port bundle with same name {0} have different definition", bundle_name));
            }
            bundle_hashs.emplace(generator, hash);

            ref_generator = generator;
            ref_port_ref = ref;
        }
        // for now we require the naming of the bundle has to be the same
        bool initialized = false;
        uint64_t base_hash = 0;
        for (auto const& iter : bundle_hashs) {
            uint64_t hash = iter.second;
            if (!initialized) {
                initialized = true;
                base_hash = hash;
            } else {
                if (base_hash != hash) {
                    throw UserException(::format(
                        "Port bundle with same name {0} have different definition", bundle_name));
                }
            }
        }
        if (!ref_generator) throw InternalException("ref generator cannot be null");
        // create a packed struct
        std::vector<std::tuple<std::string, uint32_t, bool>> def;
        auto const& mapping = ref_port_ref->name_mappings();
        for (auto const& [var_name, real_name] : mapping) {
            auto port = ref_generator->get_port(real_name);
            def.emplace_back(std::make_tuple(var_name, port->width(), port->is_signed()));
        }
        auto struct_ = std::make_shared<PackedStruct>(bundle_name, def);
        for (auto const& [entry_name, generator] : generators) {
            auto* p = dynamic_cast<Generator*>(generator->parent());
            // move sources around the ports
            auto ref = generator->get_bundle_ref(entry_name);
            auto const& m = ref->name_mappings();
            auto dir = generator->get_port(m.begin()->second)->port_direction();
            auto& packed = generator->port_packed(dir, entry_name, struct_);

            for (auto const& [attr, real_name] : m) {
                auto target = generator->get_port(real_name);
                auto& slice = packed[attr];
                if (dir != target->port_direction())
                    throw InternalException("Direction doesn't match");
                // depends on the direction, the parent can change;
                if (dir == PortDirection::In) {
                    if (p) {
                        Var::move_src_to(target.get(), &slice, p, false);
                    }
                    Var::move_sink_to(target.get(), &slice, generator, false);
                } else {
                    Var::move_src_to(target.get(), &slice, generator, false);
                    if (p) {
                        Var::move_sink_to(target.get(), &slice, p, false);
                    }
                }
                // remove target
                generator->remove_port(real_name);
            }
            // remove bundle info
            generator->remove_bundle_port_ref(entry_name);
        }
    }
}